

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O3

void http_txn_cb(void *arg)

{
  undefined1 __dest [8];
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  ulonglong size;
  nni_http_chunk *ch;
  void *__src;
  size_t sVar4;
  undefined1 local_40 [8];
  nni_iov iov;
  char *end;
  
  nni_mtx_lock(&http_txn_lk);
  nVar1 = nni_aio_result((nni_aio *)arg);
  if (nVar1 == NNG_OK) {
    switch(*(undefined4 *)((long)arg + 0x200)) {
    case 0:
      *(undefined4 *)((long)arg + 0x200) = 1;
      nni_http_read_res(*(nni_http_conn **)((long)arg + 0x1e8),(nni_aio *)arg);
LAB_0013951f:
      nni_mtx_unlock(&http_txn_lk);
      return;
    case 1:
      pcVar3 = nni_http_get_method(*(nng_http **)((long)arg + 0x1e8));
      iVar2 = strcmp(pcVar3,"HEAD");
      if (((iVar2 == 0) ||
          (pcVar3 = nni_http_get_header(*(nng_http **)((long)arg + 0x1e8),"Transfer-Encoding"),
          pcVar3 == (char *)0x0)) || (pcVar3 = strstr(pcVar3,"chunked"), pcVar3 == (char *)0x0)) {
        pcVar3 = nni_http_get_method(*(nng_http **)((long)arg + 0x1e8));
        iVar2 = strcmp(pcVar3,"HEAD");
        if (((iVar2 == 0) ||
            (pcVar3 = nni_http_get_header(*(nng_http **)((long)arg + 0x1e8),"Content-Length"),
            pcVar3 == (char *)0x0)) ||
           ((size = strtoull(pcVar3,(char **)&iov.iov_len,10), iov.iov_len == 0 || size == 0 ||
            (*(char *)iov.iov_len != '\0')))) goto switchD_00139504_caseD_2;
        nVar1 = nni_http_res_alloc_data(*(nni_http_res **)((long)arg + 0x1f0),size);
        if (nVar1 == NNG_OK) {
          nni_http_get_body(*(nng_http **)((long)arg + 0x1e8),(void **)local_40,(size_t *)&iov);
          nni_aio_set_iov((nni_aio *)arg,1,(nni_iov *)local_40);
          *(undefined4 *)((long)arg + 0x200) = 2;
          nni_http_read_full(*(nni_http_conn **)((long)arg + 0x1e8),(nni_aio *)arg);
          nni_mtx_unlock(&http_txn_lk);
          return;
        }
      }
      else {
        nVar1 = nni_http_chunks_init((nni_http_chunks **)((long)arg + 0x1f8),0);
        if (nVar1 == NNG_OK) {
          *(undefined4 *)((long)arg + 0x200) = 3;
          nni_http_read_chunks
                    (*(nni_http_conn **)((long)arg + 0x1e8),*(nni_http_chunks **)((long)arg + 0x1f8)
                     ,(nni_aio *)arg);
          goto LAB_0013951f;
        }
      }
      break;
    case 2:
switchD_00139504_caseD_2:
      nVar1 = NNG_OK;
      goto LAB_001394ba;
    case 3:
      iov.iov_len = nni_http_chunks_size(*(nni_http_chunks **)((long)arg + 0x1f8));
      nVar1 = nni_http_res_alloc_data(*(nni_http_res **)((long)arg + 0x1f0),iov.iov_len);
      if (nVar1 == NNG_OK) {
        nni_http_get_body(*(nng_http **)((long)arg + 0x1e8),(void **)local_40,&iov.iov_len);
        ch = nni_http_chunks_iter(*(nni_http_chunks **)((long)arg + 0x1f8),(nni_http_chunk *)0x0);
        __dest = local_40;
        while (local_40 = __dest, ch != (nni_http_chunk *)0x0) {
          __src = nni_http_chunk_data(ch);
          sVar4 = nni_http_chunk_size(ch);
          memcpy((void *)__dest,__src,sVar4);
          sVar4 = nni_http_chunk_size(ch);
          local_40 = (undefined1  [8])((long)local_40 + sVar4);
          ch = nni_http_chunks_iter(*(nni_http_chunks **)((long)arg + 0x1f8),ch);
          __dest = local_40;
        }
        http_txn_finish_aios((http_txn *)arg,0);
        nni_mtx_unlock(&http_txn_lk);
        nni_reap(&http_txn_reaplist,arg);
        return;
      }
      break;
    default:
      nVar1 = NNG_OK;
    }
    http_txn_finish_aios((http_txn *)arg,nVar1);
    nni_http_conn_close(*(nni_http_conn **)((long)arg + 0x1e8));
  }
  else {
LAB_001394ba:
    http_txn_finish_aios((http_txn *)arg,nVar1);
  }
  nni_mtx_unlock(&http_txn_lk);
  nni_reap(&http_txn_reaplist,arg);
  return;
}

Assistant:

static void
http_txn_cb(void *arg)
{
	http_txn       *txn = arg;
	const char     *str;
	char           *end;
	nng_err         rv;
	uint64_t        len;
	nni_iov         iov;
	char           *dst;
	size_t          sz;
	nni_http_chunk *chunk = NULL;

	nni_mtx_lock(&http_txn_lk);
	if ((rv = nni_aio_result(&txn->aio)) != NNG_OK) {
		http_txn_finish_aios(txn, rv);
		nni_mtx_unlock(&http_txn_lk);
		http_txn_fini(txn);
		return;
	}
	switch (txn->state) {
	case HTTP_SENDING:
		txn->state = HTTP_RECVING;
		nni_http_read_res(txn->conn, &txn->aio);
		nni_mtx_unlock(&http_txn_lk);
		return;

	case HTTP_RECVING:

		// Detect chunked encoding.  You poor bastard.  (Only if not
		// HEAD.)
		if ((strcmp(nni_http_get_method(txn->conn), "HEAD") != 0) &&
		    ((str = nni_http_get_header(
		          txn->conn, "Transfer-Encoding")) != NULL) &&
		    (strstr(str, "chunked") != NULL)) {

			if ((rv = nni_http_chunks_init(&txn->chunks, 0)) !=
			    NNG_OK) {
				goto error;
			}
			txn->state = HTTP_RECVING_CHUNKS;
			nni_http_read_chunks(
			    txn->conn, txn->chunks, &txn->aio);
			nni_mtx_unlock(&http_txn_lk);
			return;
		}

		if ((strcmp(nni_http_get_method(txn->conn), "HEAD") == 0) ||
		    ((str = nni_http_get_header(
		          txn->conn, "Content-Length")) == NULL) ||
		    ((len = (uint64_t) strtoull(str, &end, 10)) == 0) ||
		    (end == NULL) || (*end != '\0')) {
			// If no content-length, or HEAD (which per RFC
			// never transfers data), then we are done.
			http_txn_finish_aios(txn, 0);
			nni_mtx_unlock(&http_txn_lk);
			http_txn_fini(txn);
			return;
		}

		if ((rv = nni_http_res_alloc_data(txn->res, (size_t) len)) !=
		    NNG_OK) {
			goto error;
		}
		nni_http_get_body(txn->conn, &iov.iov_buf, &iov.iov_len);
		nni_aio_set_iov(&txn->aio, 1, &iov);
		txn->state = HTTP_RECVING_BODY;
		nni_http_read_full(txn->conn, &txn->aio);
		nni_mtx_unlock(&http_txn_lk);
		return;

	case HTTP_RECVING_BODY:
		// All done!
		http_txn_finish_aios(txn, 0);
		nni_mtx_unlock(&http_txn_lk);
		http_txn_fini(txn);
		return;

	case HTTP_RECVING_CHUNKS:
		// All done, but now we need to coalesce the chunks, for
		// yet *another* copy.  Chunked transfers are such crap.
		sz = nni_http_chunks_size(txn->chunks);
		if ((rv = nni_http_res_alloc_data(txn->res, sz)) != 0) {
			goto error;
		}
		nni_http_get_body(txn->conn, (void **) &dst, &sz);
		while ((chunk = nni_http_chunks_iter(txn->chunks, chunk)) !=
		    NULL) {
			memcpy(dst, nni_http_chunk_data(chunk),
			    nni_http_chunk_size(chunk));
			dst += nni_http_chunk_size(chunk);
		}
		http_txn_finish_aios(txn, 0);
		nni_mtx_unlock(&http_txn_lk);
		http_txn_fini(txn);
		return;
	}

error:
	http_txn_finish_aios(txn, rv);
	nni_http_conn_close(txn->conn);
	nni_mtx_unlock(&http_txn_lk);
	http_txn_fini(txn);
}